

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::TempArray<std::vector,_Assimp::Blender::BlenderModifier>::~TempArray
          (TempArray<std::vector,_Assimp::Blender::BlenderModifier> *this)

{
  bool bVar1;
  reference ppBVar2;
  BlenderModifier *elem;
  iterator __end0;
  iterator __begin0;
  mywrap *__range3;
  TempArray<std::vector,_Assimp::Blender::BlenderModifier> *this_local;
  
  __end0 = ::std::
           vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
           ::begin((vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                    *)this);
  elem = (BlenderModifier *)
         ::std::
         vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
         ::end((vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
                *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
              ::operator*(&__end0);
    if (*ppBVar2 != (BlenderModifier *)0x0) {
      (*(*ppBVar2)->_vptr_BlenderModifier[1])();
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Blender::BlenderModifier_**,_std::vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>_>
    ::operator++(&__end0);
  }
  ::std::
  vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>::
  ~vector((vector<Assimp::Blender::BlenderModifier_*,_std::allocator<Assimp::Blender::BlenderModifier_*>_>
           *)this);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }